

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Var::assign_(Var *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  bool bVar1;
  UserException *this_00;
  VarException *pVVar2;
  element_type *peVar3;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::AssignStmt> sVar4;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  enable_shared_from_this<kratos::Var> local_308;
  undefined1 local_2f3;
  undefined1 local_2f2;
  allocator<const_kratos::IRNode_*> local_2f1;
  IRNode *local_2f0;
  element_type *local_2e8;
  iterator local_2e0;
  size_type local_2d8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_2d0;
  char local_2b8 [32];
  string local_298;
  undefined1 auStack_278 [8];
  AllConcat all_concat;
  IRNode *local_220;
  element_type *local_218;
  iterator local_210;
  size_type local_208;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_200;
  char local_1e8 [32];
  string local_1c8;
  undefined1 local_1a5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *p_Stack_150;
  AssignmentType type_local;
  shared_ptr<kratos::Var> *var_local;
  Var *this_local;
  shared_ptr<kratos::AssignStmt> *stmt;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_130;
  basic_string_view<char> local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_e0) [33];
  char *local_d8;
  string *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char (*local_70) [35];
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  p_Stack_150 = (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(in_register_00000014,type);
  var_local = var;
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)p_Stack_150);
  if (!bVar1) {
    local_1a5 = 1;
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(&local_198);
    std::operator+(&local_178,"Trying to assign null to ",&local_198);
    UserException::UserException(this_00,&local_178);
    local_1a5 = 0;
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  if (*(int *)&var[0x16].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != 3) {
    if (*(int *)&var[0x16].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi == 1) {
      all_concat.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
      all_concat.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      all_concat.super_IRVisitor.visited_._M_h._M_element_count = 0;
      all_concat.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      all_concat.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
      all_concat.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
      all_concat.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      all_concat.super_IRVisitor.level = 0;
      all_concat.super_IRVisitor._12_4_ = 0;
      all_concat.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x0;
      auStack_278 = (undefined1  [8])0x0;
      all_concat.super_IRVisitor._vptr_IRVisitor = (_func_int **)0x0;
      AllConcat::AllConcat((AllConcat *)auStack_278);
      IRVisitor::visit_root((IRVisitor *)auStack_278,(IRNode *)var);
      if (((ulong)all_concat.super_IRVisitor.visited_._M_h._M_single_bucket & 1) == 0) {
        local_2f2 = 1;
        pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
        peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)p_Stack_150);
        (*(peVar3->super_IRNode)._vptr_IRNode[0x1f])(local_2b8);
        vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&var[7].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        local_60 = &local_298;
        local_68 = "Cannot assign {0} to an expression";
        local_70 = (char (*) [35])local_2b8;
        fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string&,char[35],char>
                  (&local_a8,(v7 *)"Cannot assign {0} to an expression",local_70,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,in_R8);
        local_80 = &local_a8;
        local_b8 = fmt::v7::to_string_view<char,_0>(local_68);
        local_50 = &local_c8;
        local_58 = local_80;
        local_28 = local_80;
        local_18 = local_80;
        local_20 = local_50;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_50,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_80);
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_c8.field_1.values_;
        format_str_00.size_ = local_c8.desc_;
        format_str_00.data_ = (char *)local_b8.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_298,(detail *)local_b8.data_,format_str_00,args_00);
        local_2f0 = (IRNode *)var;
        local_2e8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(p_Stack_150);
        local_2e0 = &local_2f0;
        local_2d8 = 2;
        std::allocator<const_kratos::IRNode_*>::allocator(&local_2f1);
        __l._M_len = local_2d8;
        __l._M_array = local_2e0;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_2d0,__l,&local_2f1);
        VarException::VarException(pVVar2,&local_298,&local_2d0);
        local_2f2 = 0;
        __cxa_throw(pVVar2,&VarException::typeinfo,VarException::~VarException);
      }
      AllConcat::~AllConcat((AllConcat *)auStack_278);
    }
    local_2f3 = 0;
    std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_308);
    std::
    make_shared<kratos::AssignStmt,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>const&,kratos::AssignmentType&>
              ((shared_ptr<kratos::Var> *)this,(shared_ptr<kratos::Var> *)&local_308,
               (AssignmentType *)p_Stack_150);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_308);
    sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<kratos::AssignStmt>)
           sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
  }
  all_concat._78_1_ = 1;
  pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      p_Stack_150);
  (*(peVar3->super_IRNode)._vptr_IRNode[0x1f])(local_1e8);
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&var[7].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_d0 = &local_1c8;
  local_d8 = "Cannot assign {0} to a const {1}";
  local_e0 = (char (*) [33])local_1e8;
  fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string&,char[33],char>
            (&local_118,(v7 *)"Cannot assign {0} to a const {1}",local_e0,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
  local_f0 = &local_118;
  local_128 = fmt::v7::to_string_view<char,_0>(local_d8);
  local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&stmt;
  local_48 = local_f0;
  local_38 = local_f0;
  local_10 = local_f0;
  local_30 = local_40;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_40,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_f0);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_130.values_;
  format_str.size_ = (size_t)stmt;
  format_str.data_ = (char *)local_128.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_1c8,(detail *)local_128.data_,format_str,args);
  local_220 = (IRNode *)var;
  local_218 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(p_Stack_150);
  local_210 = &local_220;
  local_208 = 2;
  std::allocator<const_kratos::IRNode_*>::allocator
            ((allocator<const_kratos::IRNode_*> *)&all_concat.field_0x4f);
  __l_00._M_len = local_208;
  __l_00._M_array = local_210;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_200,__l_00,(allocator_type *)&all_concat.field_0x4f);
  VarException::VarException(pVVar2,&local_1c8,&local_200);
  all_concat._78_1_ = 0;
  __cxa_throw(pVVar2,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

std::shared_ptr<AssignStmt> Var::assign_(const std::shared_ptr<Var> &var, AssignmentType type) {
    if (!var) {
        throw UserException("Trying to assign null to " + to_string());
    }
    // if it's a constant or expression, it can't be assigned to
    if (type_ == VarType::ConstValue) {
        throw VarException(::format("Cannot assign {0} to a const {1}", var->to_string(), name),
                           {this, var.get()});
    } else if (type_ == VarType::Expression) {
        auto all_concat = AllConcat();
        all_concat.visit_root(this);
        if (!all_concat.legal)
            throw VarException(
                ::format("Cannot assign {0} to an expression", var->to_string(), name),
                {this, var.get()});
    }

    auto stmt = ::make_shared<AssignStmt>(shared_from_this(), var, type);

    return stmt;
}